

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O1

string * __thiscall
RigidBodyDynamics::Model::GetBodyName_abi_cxx11_
          (string *__return_storage_ptr__,Model *this,uint body_id)

{
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  
  p_Var1 = (this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 == &(this->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    if (p_Var1[2]._M_color == body_id) break;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(p_Var1 + 1),
             (long)&(p_Var1[1]._M_parent)->_M_color + *(long *)(p_Var1 + 1));
  return __return_storage_ptr__;
}

Assistant:

std::string GetBodyName (unsigned int body_id) const {
		std::map<std::string, unsigned int>::const_iterator iter = mBodyNameMap.begin();

		while (iter != mBodyNameMap.end()) {
			if (iter->second == body_id)
				return iter->first;

			iter++;
		}

		return "";
	}